

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

MsgType * FIX::identifyType(MsgType *__return_storage_ptr__,string *message)

{
  long lVar1;
  MessageParseError *pMVar2;
  allocator<char> local_49;
  string value;
  
  lVar1 = std::__cxx11::string::find((char *)message,0x115733);
  if (lVar1 == -1) {
    pMVar2 = (MessageParseError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&value,"",&local_49);
    MessageParseError::MessageParseError(pMVar2,&value);
    __cxa_throw(pMVar2,&MessageParseError::typeinfo,Exception::~Exception);
  }
  lVar1 = std::__cxx11::string::find((char)message,1);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&value,(ulong)message);
    MsgType::MsgType(__return_storage_ptr__,&value);
    std::__cxx11::string::~string((string *)&value);
    return __return_storage_ptr__;
  }
  pMVar2 = (MessageParseError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"",&local_49);
  MessageParseError::MessageParseError(pMVar2,&value);
  __cxa_throw(pMVar2,&MessageParseError::typeinfo,Exception::~Exception);
}

Assistant:

inline MsgType identifyType( const std::string& message )
EXCEPT ( MessageParseError )
{
  std::string::size_type pos = message.find( "\001" "35=" );
  if ( pos == std::string::npos ) throw MessageParseError();

  std::string::size_type startValue = pos + 4;
  std::string::size_type soh = message.find_first_of( '\001', startValue );
  if ( soh == std::string::npos ) throw MessageParseError();

  std::string value = message.substr( startValue, soh - startValue );
  return MsgType( value );
}